

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zhash.c
# Opt level: O0

int zhash_get_volatile(zhash_t *zh,void *key,void *out_value)

{
  uint32_t uVar1;
  int iVar2;
  void *this_key;
  uint32_t entry_idx;
  uint32_t code;
  void *out_value_local;
  void *key_local;
  zhash_t *zh_local;
  
  uVar1 = (*zh->hash)(key);
  this_key._0_4_ = uVar1 & zh->nentries - 1U;
  while( true ) {
    if (zh->entries[(uint)this_key * zh->entrysz] == '\0') {
      return 0;
    }
    iVar2 = (*zh->equals)(key,zh->entries + ((uint)this_key * zh->entrysz + 1));
    if (iVar2 != 0) break;
    this_key._0_4_ = (uint)this_key + 1 & zh->nentries - 1U;
  }
  *(char **)out_value = zh->entries + (ulong)((uint)this_key * zh->entrysz + 1) + zh->keysz;
  return 1;
}

Assistant:

int zhash_get_volatile(const zhash_t *zh, const void *key, void *out_value)
{
    uint32_t code = zh->hash(key);
    uint32_t entry_idx = code & (zh->nentries - 1);

    while (zh->entries[entry_idx * zh->entrysz]) {
        void *this_key = &zh->entries[entry_idx * zh->entrysz + 1];
        if (zh->equals(key, this_key)) {
            *((void**) out_value) = &zh->entries[entry_idx * zh->entrysz + 1 + zh->keysz];
            return 1;
        }

        entry_idx = (entry_idx + 1) & (zh->nentries - 1);
    }

    return 0;
}